

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O1

void CompiledMixedType<unsigned_short,signed_char>(void)

{
  undefined8 uVar1;
  short sVar2;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar3;
  undefined8 in_RAX;
  unsigned_short ret;
  undefined8 local_18;
  
  local_18._2_6_ = (uint6)((ulong)in_RAX >> 0x10);
  local_18 = CONCAT62(local_18._2_6_,1);
  uVar1 = local_18;
  local_18._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  local_18._0_4_ = CONCAT13(1,(int3)uVar1);
  local_18 = local_18 & 0xffffffffffff;
  DivisionHelper<unsigned_short,_signed_char,_1>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((unsigned_short *)&local_18,(char *)((long)&local_18 + 3),
             (unsigned_short *)((long)&local_18 + 6));
  operator/('\x01',local_18._0_2_);
  local_18._0_5_ = CONCAT14(1,(undefined4)local_18);
  DivisionHelper<unsigned_short,_signed_char,_1>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((unsigned_short *)&local_18,(char *)((long)&local_18 + 4),(unsigned_short *)&local_18);
  local_18._0_6_ = CONCAT15(1,(undefined5)local_18);
  DivisionHelper<unsigned_short,_signed_char,_1>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((unsigned_short *)&local_18,(char *)((long)&local_18 + 5),(unsigned_short *)&local_18);
  if ((local_18._0_2_ != 0xffff) &&
     (sVar2 = local_18._0_2_ + 1, local_18 = CONCAT62(local_18._2_6_,sVar2), sVar2 != -1)) {
    local_18 = (ulong)local_18._2_6_ << 0x10;
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_18,'\x01');
    SVar3 = SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                      ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)&local_18,
                       (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       0x1);
    operator<<(SVar3.m_int,
               (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_18,'\x01');
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_18,
               (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_18,'\x01');
    SVar3 = SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                      ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)&local_18,
                       (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       0x1);
    operator>>(SVar3.m_int,
               (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_18,'\x01');
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_18,
               (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}